

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_negotiate_alps(SSL_HANDSHAKE *hs,uint8_t *out_alert,SSL_CLIENT_HELLO *client_hello)

{
  SSL *ssl_00;
  Span<const_unsigned_char> in;
  bool bVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  size_t sVar5;
  pointer psVar6;
  size_t in_R8;
  Span<const_unsigned_char> protocol;
  Span<unsigned_char> local_c0;
  Span<const_unsigned_char> local_b0;
  Span<const_unsigned_char> local_a0;
  undefined1 local_90 [8];
  CBS protocol_name;
  CBS alps_list;
  Span<const_unsigned_char> *pSStack_68;
  bool found;
  uchar *local_60;
  uint16_t local_52;
  undefined1 auStack_50 [6];
  uint16_t extension_type;
  Span<const_unsigned_char> settings;
  CBS alps_contents;
  SSL *ssl;
  SSL_CLIENT_HELLO *client_hello_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  bVar1 = Array<unsigned_char>::empty(&ssl_00->s3->alpn_selected);
  if (bVar1) {
    return true;
  }
  Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)auStack_50);
  local_52 = 0x4469;
  if ((*(ushort *)&hs->config->field_0x10d >> 0xd & 1) != 0) {
    local_52 = 0x44cd;
  }
  uVar3 = ssl_protocol_version(ssl_00);
  if (0x303 < uVar3) {
    Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&stack0xffffffffffffff98,&ssl_00->s3->alpn_selected);
    protocol.size_ = in_R8;
    protocol.data_ = local_60;
    bVar1 = ssl_get_local_application_settings
                      ((bssl *)hs,(SSL_HANDSHAKE *)auStack_50,pSStack_68,protocol);
    if ((bVar1) &&
       (bVar1 = ssl_client_hello_get_extension(client_hello,(CBS *)&settings.size_,local_52), bVar1)
       ) {
      bVar1 = false;
      iVar4 = CBS_get_u16_length_prefixed((CBS *)&settings.size_,(CBS *)&protocol_name.len);
      if ((iVar4 == 0) ||
         ((sVar5 = CBS_len((CBS *)&settings.size_), sVar5 != 0 ||
          (sVar5 = CBS_len((CBS *)&protocol_name.len), sVar5 == 0)))) {
        ERR_put_error(0x10,0,0x89,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xd85);
        *out_alert = '2';
        return false;
      }
      while (sVar5 = CBS_len((CBS *)&protocol_name.len), sVar5 != 0) {
        iVar4 = CBS_get_u8_length_prefixed((CBS *)&protocol_name.len,(CBS *)local_90);
        if ((iVar4 == 0) || (sVar5 = CBS_len((CBS *)local_90), sVar5 == 0)) {
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0xd8e);
          *out_alert = '2';
          return false;
        }
        local_a0 = cbs_st::operator_cast_to_Span((cbs_st *)local_90);
        Span<unsigned_char>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                  (&local_c0,&ssl_00->s3->alpn_selected);
        Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                  ((Span<unsigned_char_const> *)&local_b0,&local_c0);
        bVar2 = internal::operator==(local_a0,local_b0);
        if (bVar2) {
          bVar1 = true;
        }
      }
      if (bVar1) {
        psVar6 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                           (&hs->new_session);
        psVar6->field_0x1b8 = psVar6->field_0x1b8 & 0xbf | 0x40;
        psVar6 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                           (&hs->new_session);
        in.size_ = (size_t)settings.data_;
        in.data_ = (uchar *)_auStack_50;
        bVar1 = Array<unsigned_char>::CopyFrom(&psVar6->local_application_settings,in);
        if (!bVar1) {
          *out_alert = 'P';
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool ssl_negotiate_alps(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                        const SSL_CLIENT_HELLO *client_hello) {
  SSL *const ssl = hs->ssl;
  if (ssl->s3->alpn_selected.empty()) {
    return true;
  }

  // If we negotiate ALPN over TLS 1.3, try to negotiate ALPS.
  CBS alps_contents;
  Span<const uint8_t> settings;
  uint16_t extension_type = TLSEXT_TYPE_application_settings_old;
  if (hs->config->alps_use_new_codepoint) {
    extension_type = TLSEXT_TYPE_application_settings;
  }
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION &&
      ssl_get_local_application_settings(hs, &settings,
                                         ssl->s3->alpn_selected) &&
      ssl_client_hello_get_extension(client_hello, &alps_contents,
                                     extension_type)) {
    // Check if the client supports ALPS with the selected ALPN.
    bool found = false;
    CBS alps_list;
    if (!CBS_get_u16_length_prefixed(&alps_contents, &alps_list) ||  //
        CBS_len(&alps_contents) != 0 ||                              //
        CBS_len(&alps_list) == 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }
    while (CBS_len(&alps_list) > 0) {
      CBS protocol_name;
      if (!CBS_get_u8_length_prefixed(&alps_list, &protocol_name) ||
          // Empty protocol names are forbidden.
          CBS_len(&protocol_name) == 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
        *out_alert = SSL_AD_DECODE_ERROR;
        return false;
      }
      if (protocol_name == Span(ssl->s3->alpn_selected)) {
        found = true;
      }
    }

    // Negotiate ALPS if both client also supports ALPS for this protocol.
    if (found) {
      hs->new_session->has_application_settings = true;
      if (!hs->new_session->local_application_settings.CopyFrom(settings)) {
        *out_alert = SSL_AD_INTERNAL_ERROR;
        return false;
      }
    }
  }

  return true;
}